

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::init(PointSizeCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  bool bVar2;
  char cVar3;
  ContextType ctxType;
  uint uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  ostream *poVar7;
  ProgramSources *pPVar8;
  ostringstream *poVar9;
  ShaderProgram *this_00;
  NotSupportedError *pNVar10;
  TestError *this_01;
  byte bVar11;
  char *pcVar12;
  int ndx_1;
  long lVar13;
  int ndx;
  long lVar14;
  char *pcVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExtensions;
  int requiredSize;
  string local_308 [36];
  ContextType local_2e4;
  float aliasedSizeRange [2];
  string local_2d8 [32];
  string local_2b8;
  ostringstream extensionList;
  string local_118;
  ProgramSources sources;
  
  requiredExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  requiredExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  requiredExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  uVar4 = this->m_flags;
  if ((uVar4 & 0x1e) != 0 && !bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensionList,"GL_EXT_tessellation_shader",(allocator<char> *)&sources);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &requiredExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList);
    std::__cxx11::string::~string((string *)&extensionList);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0xe) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensionList,"GL_EXT_tessellation_point_size",(allocator<char> *)&sources
              );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &requiredExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList);
    std::__cxx11::string::~string((string *)&extensionList);
    uVar4 = this->m_flags;
  }
  if (!bVar2 && (uVar4 & 0xe0) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensionList,"GL_EXT_geometry_shader",(allocator<char> *)&sources);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &requiredExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList);
    std::__cxx11::string::~string((string *)&extensionList);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x60) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensionList,"GL_EXT_geometry_point_size",(allocator<char> *)&sources);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &requiredExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensionList);
    std::__cxx11::string::~string((string *)&extensionList);
  }
  bVar11 = 1;
  lVar13 = 0;
  for (lVar14 = 0;
      lVar14 < (int)((ulong)((long)requiredExtensions.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)requiredExtensions.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
      lVar14 = lVar14 + 1) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       *(char **)((long)&((requiredExtensions.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar13));
    bVar11 = bVar11 & bVar2;
    lVar13 = lVar13 + 0x20;
  }
  if (bVar11 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
    lVar14 = 0;
    for (lVar13 = 0;
        lVar13 < (int)((ulong)((long)requiredExtensions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)requiredExtensions.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar13 = lVar13 + 1) {
      if (lVar14 != 0) {
        std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)
                      ((long)&((requiredExtensions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar14));
      lVar14 = lVar14 + 0x20;
    }
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   aliasedSizeRange,"Test requires {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &requiredSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   aliasedSizeRange,"} extension(s)");
    tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&sources);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&requiredExtensions);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  aliasedSizeRange[0] = 0.0;
  aliasedSizeRange[1] = 0.0;
  iVar6 = getExpectedPointSize(this);
  requiredSize = iVar6;
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x818))(0x846d);
  if (aliasedSizeRange[1] < (float)iVar6) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)&sources,&requiredSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &extensionList,"Test requires point size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources);
    tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&extensionList);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar4 = this->m_flags;
  if ((uVar4 & 1) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Setting point size in vertex shader to 2.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 2) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 4) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Setting point size in tessellation evaluation shader to 4.0."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 8) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Not setting point size in tessellation evaluation shader (resulting in the default point size)."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x20) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Setting point size in geometry shader to 6.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    uVar4 = this->m_flags;
  }
  cVar3 = (char)uVar4;
  if ((uVar4 & 0x40) != 0) {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Reading point size in geometry shader and adding 2.0.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    cVar3 = (char)this->m_flags;
  }
  if (cVar3 < '\0') {
    extensionList.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Not setting point size in geometry shader (resulting in the default point size)."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&extensionList,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  }
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
  poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                           "${VERSION_DECL}\n");
  poVar7 = std::operator<<(poVar7,"in highp vec4 a_position;\n");
  poVar7 = std::operator<<(poVar7,"void main ()\n");
  poVar7 = std::operator<<(poVar7,"{\n");
  std::operator<<(poVar7,"\tgl_Position = a_position;\n");
  if ((this->m_flags & 1) != 0) {
    std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tgl_PointSize = 2.0;\n");
  }
  std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  local_2b8._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)&requiredExtensions,(string *)&requiredSize,(ContextType *)&local_2b8);
  std::__cxx11::string::~string((string *)&requiredSize);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extensionList);
  glu::VertexSource::VertexSource((VertexSource *)aliasedSizeRange,(string *)&requiredExtensions);
  pPVar8 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)aliasedSizeRange);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&requiredSize,
             "${VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,(allocator<char> *)&local_2e4);
  local_118._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2b8,(string *)&requiredSize,(ContextType *)&local_118);
  std::__cxx11::string::~string((string *)&requiredSize);
  glu::FragmentSource::FragmentSource((FragmentSource *)&extensionList,&local_2b8);
  glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&extensionList);
  std::__cxx11::string::~string
            ((string *)&extensionList.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string((string *)&requiredExtensions);
  uVar4 = this->m_flags;
  if ((uVar4 & 0x1e) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
    poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                             "${VERSION_DECL}\n");
    poVar7 = std::operator<<(poVar7,"${EXTENSION_TESSELATION_SHADER}");
    pcVar15 = glcts::fixed_sample_locations_values + 1;
    pcVar12 = glcts::fixed_sample_locations_values + 1;
    if ((this->m_flags & 0x10) == 0) {
      pcVar12 = "#extension GL_EXT_tessellation_point_size : require\n";
    }
    poVar7 = std::operator<<(poVar7,pcVar12);
    poVar7 = std::operator<<(poVar7,"layout(vertices = 1) out;\n");
    poVar7 = std::operator<<(poVar7,"void main ()\n");
    poVar7 = std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<(poVar7,"\tgl_TessLevelOuter[0] = 3.0;\n");
    poVar7 = std::operator<<(poVar7,"\tgl_TessLevelOuter[1] = 3.0;\n");
    poVar7 = std::operator<<(poVar7,"\tgl_TessLevelOuter[2] = 3.0;\n");
    poVar7 = std::operator<<(poVar7,"\tgl_TessLevelInner[0] = 3.0;\n");
    std::operator<<(poVar7,
                    "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n")
    ;
    if ((this->m_flags & 8U) == 0) {
      if ((this->m_flags & 2U) != 0) {
        poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\t// thrown away\n");
        pcVar12 = "\tgl_out[gl_InvocationID].gl_PointSize = 4.0;\n";
        goto LAB_0131e6dc;
      }
    }
    else {
      poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\t// pass as is to eval\n");
      pcVar12 = "\tgl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n";
LAB_0131e6dc:
      std::operator<<(poVar7,pcVar12);
    }
    std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    std::__cxx11::stringbuf::str();
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    requiredExtensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(requiredExtensions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
    specializeShader(&local_2b8,(string *)&requiredSize,(ContextType *)&requiredExtensions);
    std::__cxx11::string::~string((string *)&requiredSize);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extensionList);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)aliasedSizeRange,&local_2b8);
    pPVar8 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)aliasedSizeRange);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
    poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                             "${VERSION_DECL}\n");
    poVar7 = std::operator<<(poVar7,"${EXTENSION_TESSELATION_SHADER}");
    if ((this->m_flags & 0x10) == 0) {
      pcVar15 = "#extension GL_EXT_tessellation_point_size : require\n";
    }
    poVar7 = std::operator<<(poVar7,pcVar15);
    poVar7 = std::operator<<(poVar7,"layout(triangles, point_mode) in;\n");
    poVar7 = std::operator<<(poVar7,"void main ()\n");
    poVar7 = std::operator<<(poVar7,"{\n");
    poVar7 = std::operator<<(poVar7,"\t// hide all but one vertex\n");
    poVar7 = std::operator<<(poVar7,"\tif (gl_TessCoord.x < 0.99)\n");
    poVar7 = std::operator<<(poVar7,"\t\tgl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n");
    poVar7 = std::operator<<(poVar7,"\telse\n");
    std::operator<<(poVar7,"\t\tgl_Position = gl_in[0].gl_Position;\n");
    if ((this->m_flags & 8U) == 0) {
      if ((this->m_flags & 4U) != 0) {
        poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\n");
        poVar7 = std::operator<<(poVar7,"\t// set point size\n");
        pcVar12 = "\tgl_PointSize = 4.0;\n";
        goto LAB_0131e889;
      }
    }
    else {
      poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\n");
      poVar7 = std::operator<<(poVar7,"\t// add to point size\n");
      pcVar12 = "\tgl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
LAB_0131e889:
      std::operator<<(poVar7,pcVar12);
    }
    std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    std::__cxx11::stringbuf::str();
    local_2e4.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    specializeShader(&local_118,(string *)&requiredExtensions,&local_2e4);
    std::__cxx11::string::~string((string *)&requiredExtensions);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extensionList);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&requiredSize,&local_118);
    glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&requiredSize);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0xe0) == 0) goto LAB_0131eae3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensionList);
  poVar9 = &extensionList;
  poVar7 = std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                           "${VERSION_DECL}\n");
  poVar7 = std::operator<<(poVar7,"${EXTENSION_GEOMETRY_SHADER}");
  pcVar12 = glcts::fixed_sample_locations_values + 1;
  if (-1 < (char)this->m_flags) {
    pcVar12 = "#extension GL_EXT_geometry_point_size : require\n";
  }
  poVar7 = std::operator<<(poVar7,pcVar12);
  poVar7 = std::operator<<(poVar7,"layout (points) in;\n");
  poVar7 = std::operator<<(poVar7,"layout (points, max_vertices=1) out;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"void main ()\n");
  std::operator<<(poVar7,"{\n");
  uVar4 = this->m_flags;
  if ((uVar4 & 0x20) == 0) {
    if ((uVar4 & 0x40) != 0) {
      poVar9 = (ostringstream *)
               std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tgl_Position = gl_in[0].gl_Position;\n");
      pcVar12 = "\tgl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
      goto LAB_0131ea39;
    }
    if ((char)uVar4 < '\0') {
      pcVar12 = "\tgl_Position = gl_in[0].gl_Position;\n";
      goto LAB_0131ea39;
    }
  }
  else {
    poVar9 = (ostringstream *)
             std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tgl_Position = gl_in[0].gl_Position;\n");
    pcVar12 = "\tgl_PointSize = 6.0;\n";
LAB_0131ea39:
    std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
  }
  poVar7 = std::operator<<(&extensionList.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tEmitVertex();\n");
  std::operator<<(poVar7,"}\n");
  std::__cxx11::stringbuf::str();
  local_2b8._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)&requiredExtensions,(string *)&requiredSize,(ContextType *)&local_2b8);
  std::__cxx11::string::~string((string *)&requiredSize);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extensionList);
  glu::GeometrySource::GeometrySource
            ((GeometrySource *)aliasedSizeRange,(string *)&requiredExtensions);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)aliasedSizeRange);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string((string *)&requiredExtensions);
LAB_0131eae3:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  this->m_program = this_00;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_00);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    glu::ProgramSources::~ProgramSources(&sources);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extensionList,"failed to build program",(allocator<char> *)aliasedSizeRange)
  ;
  tcu::TestError::TestError(this_01,(string *)&extensionList);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PointSizeCase::init (void)
{
	checkExtensions();
	checkPointSizeRequirements();

	// log

	if (m_flags & FLAG_VERTEX_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_CONTROL_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_EVALUATION_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in tessellation evaluation shader (resulting in the default point size)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in geometry shader (resulting in the default point size)." << tcu::TestLog::EndMessage;

	// program

	{
		glu::ProgramSources sources;
		sources	<< glu::VertexSource(genVertexSource())
				<< glu::FragmentSource(genFragmentSource());

		if (m_flags & (FLAG_TESSELLATION_CONTROL_SET | FLAG_TESSELLATION_EVALUATION_SET | FLAG_TESSELLATION_ADD | FLAG_TESSELLATION_DONT_SET))
			sources << glu::TessellationControlSource(genTessellationControlSource())
					<< glu::TessellationEvaluationSource(genTessellationEvaluationSource());

		if (m_flags & (FLAG_GEOMETRY_SET | FLAG_GEOMETRY_ADD | FLAG_GEOMETRY_DONT_SET))
			sources << glu::GeometrySource(genGeometrySource());

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), sources);

		m_testCtx.getLog() << *m_program;
		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}
}